

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O2

int clause2_create_new(sat_solver2 *s,lit *begin,lit *end,int learnt,int proof_id)

{
  ABC_INT64_T *pAVar1;
  clause cVar2;
  int iVar3;
  int **__ptr;
  int *piVar4;
  clause *c;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  
  uVar7 = (uint)((ulong)((long)end - (long)begin) >> 2);
  if (0 < (int)uVar7) {
    uVar10 = *begin;
    if ((int)uVar10 < 0) {
      __assert_fail("size < 1 || begin[0] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x19c,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    if (uVar7 == 1) {
      if (s->size <= (int)(uVar10 >> 1)) {
LAB_0041a6e1:
        __assert_fail("size < 1 || lit_var(begin[0]) < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x19e,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
      }
    }
    else {
      if (begin[1] < 0) {
        __assert_fail("size < 2 || begin[1] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x19d,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
      }
      if (s->size <= (int)(uVar10 >> 1)) goto LAB_0041a6e1;
      if (s->size <= begin[1] >> 1) {
        __assert_fail("size < 2 || lit_var(begin[1]) < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                      ,0x19f,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
      }
    }
  }
  uVar10 = uVar7 + 3 & 0xfffffffe;
  iVar6 = 1 << ((byte)(s->Mem).nPageSize & 0x1f);
  if (iVar6 <= (int)(uVar10 + 3)) {
    __assert_fail("nInts + 3 < (1 << p->nPageSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satClause.h"
                  ,0x132,"int Sat_MemAppend(Sat_Mem_t *, int *, int, int, int)");
  }
  __ptr = (s->Mem).pPages;
  iVar3 = (s->Mem).iPage[(uint)learnt];
  piVar4 = __ptr[iVar3];
  iVar5 = *piVar4;
  if (iVar6 <= (int)(uVar10 + iVar5 + 2)) {
    iVar3 = iVar3 + 2;
    (s->Mem).iPage[(uint)learnt] = iVar3;
    iVar6 = (s->Mem).nPagesAlloc;
    if (iVar6 <= iVar3) {
      __ptr = (int **)realloc(__ptr,(long)iVar6 << 4);
      (s->Mem).pPages = __ptr;
      iVar6 = (s->Mem).nPagesAlloc;
      memset(__ptr + iVar6,0,(long)iVar6 << 3);
      (s->Mem).nPagesAlloc = iVar6 * 2;
      iVar3 = (s->Mem).iPage[(uint)learnt];
    }
    piVar4 = __ptr[iVar3];
    if (piVar4 == (int *)0x0) {
      piVar4 = (int *)malloc((long)(1 << ((byte)(s->Mem).nPageSize & 0x1f)) << 2);
      __ptr[iVar3] = piVar4;
      piVar4 = (s->Mem).pPages[iVar3];
    }
    *piVar4 = 2;
    iVar5 = 2;
  }
  piVar4[iVar5] = 0;
  puVar9 = (uint *)(piVar4 + *piVar4);
  *puVar9 = learnt & 1U | *puVar9 & 0x7fe | uVar7 << 0xb;
  if (begin != (lit *)0x0) {
    memcpy(puVar9 + 1,begin,((long)end - (long)begin) * 0x40000000 >> 0x1e & 0xfffffffffffffffc);
  }
  uVar8 = (s->Mem).nEntries[(uint)learnt];
  puVar9[(ulong)(uVar7 & 0x1fffff) + 1] = uVar8;
  (s->Mem).nEntries[(uint)learnt] = uVar8 + 1;
  *piVar4 = *piVar4 + uVar10;
  iVar6 = (s->Mem).iPage[(uint)learnt];
  uVar8 = iVar6 << ((byte)(s->Mem).nPageSize & 0x1f) | *(s->Mem).pPages[iVar6];
  if ((uVar8 & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                  ,0x1a2,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
  }
  iVar6 = uVar8 - uVar10;
  c = Sat_MemClauseHand(&s->Mem,iVar6);
  if (learnt == 0) {
    if (c[(ulong)((uint)*c >> 0xb) + 1] != (clause)(s->stats).clauses) {
      __assert_fail("clause_id(c) == (int)s->stats.clauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1b7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    (s->stats).clauses = (int)c[(ulong)((uint)*c >> 0xb) + 1] + 1;
    pAVar1 = &(s->stats).clauses_literals;
    *pAVar1 = *pAVar1 + (long)(int)uVar7;
  }
  else {
    if ((proof_id == 0) && (s->pPrf1 != (Vec_Set_t *)0x0)) {
      __assert_fail("proof_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1a7,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    uVar10 = sat_clause_compute_lbd(s,c);
    cVar2 = *c;
    *c = (clause)(((uint)cVar2 & 0xfffff807) + (uVar10 & 0xff) * 8);
    if (c[(ulong)((uint)cVar2 >> 0xb) + 1] != (clause)(s->act_clas).size) {
      __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satSolver2.c"
                    ,0x1a9,"int clause2_create_new(sat_solver2 *, lit *, lit *, int, int)");
    }
    if ((s->pPrf1 != (Vec_Set_t *)0x0) || (s->pInt2 != (Int2_Man_t *)0x0)) {
      veci_push(&s->claProofs,proof_id);
    }
    veci_push(&s->act_clas,0);
    if (2 < (int)uVar7) {
      act_clause2_bump(s,c);
    }
    puVar9 = &(s->stats).learnts;
    *puVar9 = *puVar9 + 1;
    pAVar1 = &(s->stats).learnts_literals;
    *pAVar1 = *pAVar1 + (long)(int)uVar7;
    s->hLearntLast = iVar6;
  }
  if (1 < (int)uVar7) {
    veci_push(s->wlists + ((long)*begin ^ 1),iVar6);
    veci_push(s->wlists + ((long)begin[1] ^ 1),iVar6);
  }
  return iVar6;
}

Assistant:

static int clause2_create_new(sat_solver2* s, lit* begin, lit* end, int learnt, int proof_id )
{
    clause* c;
    int h, size = end - begin;
    assert(size < 1 || begin[0] >= 0);
    assert(size < 2 || begin[1] >= 0);
    assert(size < 1 || lit_var(begin[0]) < s->size);
    assert(size < 2 || lit_var(begin[1]) < s->size);
    // create new clause
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 1 );
    assert( !(h & 1) );
    c = clause2_read( s, h );
    if (learnt)
    {
        if ( s->pPrf1 )
            assert( proof_id );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
        if ( s->pPrf1 || s->pInt2 )
            veci_push(&s->claProofs, proof_id);
//        veci_push(&s->act_clas, (1<<10));
        veci_push(&s->act_clas, 0);
        if ( size > 2 )
            act_clause2_bump( s,c );
        s->stats.learnts++;
        s->stats.learnts_literals += size;
        // remember the last one
        s->hLearntLast = h;
    }
    else
    {
        assert( clause_id(c) == (int)s->stats.clauses );
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }
    // watch the clause
    if ( size > 1 )
    {
        veci_push(solver2_wlist(s,lit_neg(begin[0])),h);
        veci_push(solver2_wlist(s,lit_neg(begin[1])),h);
    }
    return h;
}